

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::SignWithKey
          (ConfidentialTransactionContext *this,OutPoint *outpoint,Pubkey *pubkey,Privkey *privkey,
          SigHashType *sighash_type,bool has_grind_r)

{
  bool bVar1;
  CfdException *this_00;
  allocator local_561;
  Privkey *local_560;
  SigHashType local_558;
  SigHashType local_54c;
  string local_540;
  UtxoData utxo;
  
  local_560 = privkey;
  UtxoData::UtxoData(&utxo);
  bVar1 = IsFindUtxoMap(this,outpoint,&utxo);
  if (!bVar1) {
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&local_540,"Utxo is not found. sign fail.",&local_561);
    core::CfdException::CfdException(this_00,kCfdIllegalStateError,&local_540);
    __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  bVar1 = core::BlindFactor::IsEmpty(&utxo.amount_blind_factor);
  if (bVar1) {
    bVar1 = core::ConfidentialValue::HasBlinding(&utxo.value_commitment);
    if (!bVar1) {
      core::SigHashType::SigHashType(&local_54c,sighash_type);
      SignWithPrivkeySimple
                (this,outpoint,pubkey,local_560,&local_54c,&utxo.amount,utxo.address_type,
                 has_grind_r);
      goto LAB_00341ced;
    }
  }
  core::SigHashType::SigHashType(&local_558,sighash_type);
  SignWithPrivkeySimple
            (this,outpoint,pubkey,local_560,&local_558,&utxo.value_commitment,utxo.address_type,
             has_grind_r);
LAB_00341ced:
  UtxoData::~UtxoData(&utxo);
  return;
}

Assistant:

void ConfidentialTransactionContext::SignWithKey(
    const OutPoint& outpoint, const Pubkey& pubkey, const Privkey& privkey,
    SigHashType sighash_type, bool has_grind_r) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. sign fail.");
  }

  if (utxo.amount_blind_factor.IsEmpty() &&
      (!utxo.value_commitment.HasBlinding())) {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.amount,
        utxo.address_type, has_grind_r);
  } else {
    SignWithPrivkeySimple(
        outpoint, pubkey, privkey, sighash_type, utxo.value_commitment,
        utxo.address_type, has_grind_r);
  }
}